

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O0

SatType __thiscall features::Surf::filter_dxx(Surf *this,int fs,int x,int y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int index;
  ImageBase *this_00;
  element_type *peVar9;
  long *plVar10;
  SatType ret;
  SatType v7;
  SatType v6;
  SatType v5;
  SatType v4;
  SatType v3;
  SatType v2;
  SatType v1;
  SatType v0;
  int row2;
  int row1;
  int fs2;
  int w;
  int y_local;
  int x_local;
  int fs_local;
  Surf *this_local;
  
  this_00 = (ImageBase *)
            std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->sat);
  iVar8 = core::ImageBase::width(this_00);
  index = ((x - fs) - fs / 2) + -1 + iVar8 * (y - fs);
  iVar8 = index + iVar8 * (fs * 2 + -1);
  peVar9 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  plVar10 = core::Image<long>::at(peVar9,index);
  lVar1 = *plVar10;
  peVar9 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  plVar10 = core::Image<long>::at(peVar9,index + fs);
  lVar2 = *plVar10;
  peVar9 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  plVar10 = core::Image<long>::at(peVar9,index + fs * 2);
  lVar3 = *plVar10;
  peVar9 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  plVar10 = core::Image<long>::at(peVar9,index + fs * 3);
  lVar4 = *plVar10;
  peVar9 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  plVar10 = core::Image<long>::at(peVar9,iVar8);
  lVar5 = *plVar10;
  peVar9 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  plVar10 = core::Image<long>::at(peVar9,iVar8 + fs);
  lVar6 = *plVar10;
  peVar9 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  plVar10 = core::Image<long>::at(peVar9,iVar8 + fs * 2);
  lVar7 = *plVar10;
  peVar9 = std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  plVar10 = core::Image<long>::at(peVar9,iVar8 + fs * 3);
  return (((*plVar10 + lVar3) - lVar7) - lVar4) +
         ((lVar6 + lVar1) - lVar5) + lVar2 * -3 + lVar7 * -2 + lVar6 * 2 + lVar3 * 2;
}

Assistant:

Surf::SatType
Surf::filter_dxx (int fs, int x, int y)
{
    int const w = this->sat->width();
    int const fs2 = fs / 2;
    int const row1 = (x - fs - fs2 - 1) + w * (y - fs);
    int const row2 = row1 + w * (fs + fs - 1);

    Surf::SatType const v0 = this->sat->at(row1);
    Surf::SatType const v1 = this->sat->at(row1 + fs);
    Surf::SatType const v2 = this->sat->at(row1 + 2 * fs);
    Surf::SatType const v3 = this->sat->at(row1 + 3 * fs);
    Surf::SatType const v4 = this->sat->at(row2);
    Surf::SatType const v5 = this->sat->at(row2 + fs);
    Surf::SatType const v6 = this->sat->at(row2 + 2 * fs);
    Surf::SatType const v7 = this->sat->at(row2 + 3 * fs);

    Surf::SatType ret = 0;
    ret += v5 + v0 - v4 - v1;
    ret -= 2 * (v6 + v1 - v5 - v2);
    ret += v7 + v2 - v6 - v3;
    return ret;
}